

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O1

void __thiscall QtMWidgets::Switch::setOnColor(Switch *this,QColor *c)

{
  State SVar1;
  SwitchPrivate *pSVar2;
  undefined8 uVar3;
  char cVar4;
  
  cVar4 = QColor::operator!=(&((this->d).d)->onColor,c);
  if (cVar4 != '\0') {
    pSVar2 = (this->d).d;
    uVar3 = *(undefined8 *)c;
    *(undefined8 *)((long)&(pSVar2->onColor).ct + 2) = *(undefined8 *)((long)&c->ct + 2);
    *(undefined8 *)&pSVar2->onColor = uVar3;
    SVar1 = ((this->d).d)->state;
    if ((SVar1 == AcceptedCheck) || (SVar1 == NotAcceptedUncheck)) {
      QWidget::update();
      return;
    }
  }
  return;
}

Assistant:

void
Switch::setOnColor( const QColor & c )
{
	if( d->onColor != c )
	{
		d->onColor = c;

		switch( d->state )
		{
			case AcceptedCheck :
			case NotAcceptedUncheck :
				update();
			break;

			default:
				break;
		}
	}
}